

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topological_sort.cpp
# Opt level: O0

vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *
handlegraph::algorithms::topological_order(HandleGraph *g)

{
  bool bVar1;
  reference phVar2;
  reference ppVar3;
  mapped_type *pmVar4;
  pointer ppVar5;
  long *in_RSI;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *in_RDI;
  handle_t n;
  handle_t first_seed;
  map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
  unvisited;
  handle_t *head;
  iterator __end2;
  iterator __begin2;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *__range2;
  map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
  seeds;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> heads;
  map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
  s;
  unordered_set<std::pair<handlegraph::handle_t,_handlegraph::handle_t>,_std::hash<std::pair<handlegraph::handle_t,_handlegraph::handle_t>_>,_std::equal_to<std::pair<handlegraph::handle_t,_handlegraph::handle_t>_>,_std::allocator<std::pair<handlegraph::handle_t,_handlegraph::handle_t>_>_>
  masked_edges;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *sorted;
  map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
  *in_stack_fffffffffffffd58;
  map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
  *in_stack_fffffffffffffd60;
  iterator in_stack_fffffffffffffd68;
  map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
  *in_stack_fffffffffffffd70;
  HandleGraph *in_stack_fffffffffffffd88;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *in_stack_fffffffffffffd90;
  key_type *in_stack_fffffffffffffd98;
  map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
  *in_stack_fffffffffffffda0;
  anon_class_48_6_42b21c5e *in_stack_fffffffffffffda8;
  HandleGraph *in_stack_fffffffffffffdb0;
  handle_t *in_stack_fffffffffffffdb8;
  undefined6 in_stack_fffffffffffffdc0;
  byte bVar6;
  byte bVar7;
  undefined8 local_1a0;
  _Base_ptr local_198;
  _Base_ptr local_190;
  _Base_ptr local_188;
  _Base_ptr local_180;
  _Base_ptr local_178;
  key_type *local_170;
  anon_class_48_6_42b21c5e *local_168;
  handle_t *local_160;
  _Base_ptr local_158;
  mapped_type local_150;
  undefined1 *local_148;
  long **local_140;
  map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
  *local_138;
  map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
  local_130;
  undefined8 local_100;
  reference local_f8;
  handle_t *local_f0;
  __normal_iterator<handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
  local_e8;
  undefined1 *local_e0;
  undefined1 local_a8 [24];
  undefined1 local_90 [127];
  byte local_11;
  long *local_10 [2];
  
  local_11 = 0;
  local_10[0] = in_RSI;
  std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::vector
            ((vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *)0x24bf07);
  (**(code **)(*local_10[0] + 0x48))();
  std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::reserve
            (in_stack_fffffffffffffd90,(size_type)in_stack_fffffffffffffd88);
  std::
  unordered_set<std::pair<handlegraph::handle_t,_handlegraph::handle_t>,_std::hash<std::pair<handlegraph::handle_t,_handlegraph::handle_t>_>,_std::equal_to<std::pair<handlegraph::handle_t,_handlegraph::handle_t>_>,_std::allocator<std::pair<handlegraph::handle_t,_handlegraph::handle_t>_>_>
  ::unordered_set((unordered_set<std::pair<handlegraph::handle_t,_handlegraph::handle_t>,_std::hash<std::pair<handlegraph::handle_t,_handlegraph::handle_t>_>,_std::equal_to<std::pair<handlegraph::handle_t,_handlegraph::handle_t>_>,_std::allocator<std::pair<handlegraph::handle_t,_handlegraph::handle_t>_>_>
                   *)0x24bf46);
  std::
  map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
  ::map((map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
         *)0x24bf53);
  head_nodes(in_stack_fffffffffffffd88);
  std::
  map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
  ::map((map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
         *)0x24bf77);
  local_e0 = local_a8;
  local_e8._M_current =
       (handle_t *)
       std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::begin
                 ((vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *)
                  in_stack_fffffffffffffd58);
  local_f0 = (handle_t *)
             std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::end
                       ((vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *)
                        in_stack_fffffffffffffd58);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
                             *)in_stack_fffffffffffffd60,
                            (__normal_iterator<handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
                             *)in_stack_fffffffffffffd58), bVar1) {
    phVar2 = __gnu_cxx::
             __normal_iterator<handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
             ::operator*(&local_e8);
    local_f8 = phVar2;
    local_100 = (**(code **)(*local_10[0] + 0x20))();
    pmVar4 = std::
             map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
             ::operator[](in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    *(undefined8 *)pmVar4->data = *(undefined8 *)phVar2->data;
    __gnu_cxx::
    __normal_iterator<handlegraph::handle_t_*,_std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>_>
    ::operator++(&local_e8);
  }
  std::
  map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
  ::map((map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
         *)0x24c0bd);
  local_148 = local_90;
  local_140 = local_10;
  local_138 = &local_130;
  HandleGraph::
  for_each_handle<handlegraph::algorithms::topological_order(handlegraph::HandleGraph_const*)::__0>
            (in_stack_fffffffffffffdb0,(anon_class_24_3_991549b4 *)in_stack_fffffffffffffda8,
             SUB81((ulong)in_stack_fffffffffffffda0 >> 0x38,0));
  while( true ) {
    bVar1 = std::
            map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
            ::empty((map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
                     *)0x24c112);
    bVar7 = 1;
    if (bVar1) {
      bVar1 = std::
              map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
              ::empty((map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
                       *)0x24c12e);
      bVar7 = bVar1 ^ 0xff;
    }
    if ((bVar7 & 1) == 0) break;
    while( true ) {
      bVar1 = std::
              map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
              ::empty((map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
                       *)0x24c150);
      bVar6 = 0;
      if (bVar1) {
        bVar1 = std::
                map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
                ::empty((map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
                         *)0x24c16c);
        bVar6 = bVar1 ^ 0xff;
      }
      if ((bVar6 & 1) == 0) break;
      local_158 = (_Base_ptr)
                  std::
                  map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
                  ::begin(in_stack_fffffffffffffd58);
      ppVar3 = std::_Rb_tree_iterator<std::pair<const_long_long,_handlegraph::handle_t>_>::operator*
                         ((_Rb_tree_iterator<std::pair<const_long_long,_handlegraph::handle_t>_> *)
                          0x24c1a1);
      local_150.data = *&(ppVar3->second).data;
      in_stack_fffffffffffffdb8 =
           (handle_t *)(**(code **)(*local_10[0] + 0x20))(local_10[0],&local_150);
      local_160 = in_stack_fffffffffffffdb8;
      in_stack_fffffffffffffdb0 =
           (HandleGraph *)
           std::
           map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
           ::count(in_stack_fffffffffffffd70,(key_type *)in_stack_fffffffffffffd68._M_node);
      if (in_stack_fffffffffffffdb0 != (HandleGraph *)0x0) {
        in_stack_fffffffffffffda8 =
             (anon_class_48_6_42b21c5e *)(**(code **)(*local_10[0] + 0x20))(local_10[0],&local_150);
        local_168 = in_stack_fffffffffffffda8;
        in_stack_fffffffffffffda0 =
             (map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
              *)std::
                map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
                ::operator[](in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
        (in_stack_fffffffffffffda0->_M_t)._M_impl.field_0x0 = local_150.data[0];
        (in_stack_fffffffffffffda0->_M_t)._M_impl.field_0x1 = local_150.data[1];
        (in_stack_fffffffffffffda0->_M_t)._M_impl.field_0x2 = local_150.data[2];
        (in_stack_fffffffffffffda0->_M_t)._M_impl.field_0x3 = local_150.data[3];
        (in_stack_fffffffffffffda0->_M_t)._M_impl.field_0x4 = local_150.data[4];
        (in_stack_fffffffffffffda0->_M_t)._M_impl.field_0x5 = local_150.data[5];
        (in_stack_fffffffffffffda0->_M_t)._M_impl.field_0x6 = local_150.data[6];
        (in_stack_fffffffffffffda0->_M_t)._M_impl.field_0x7 = local_150.data[7];
        in_stack_fffffffffffffd98 =
             (key_type *)(**(code **)(*local_10[0] + 0x20))(local_10[0],&local_150);
        local_170 = in_stack_fffffffffffffd98;
        std::
        map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
        ::erase(in_stack_fffffffffffffd60,(key_type *)in_stack_fffffffffffffd58);
      }
      local_178 = (_Base_ptr)
                  std::
                  map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
                  ::begin(in_stack_fffffffffffffd58);
      local_180 = (_Base_ptr)
                  std::
                  map<long_long,handlegraph::handle_t,std::less<long_long>,std::allocator<std::pair<long_long_const,handlegraph::handle_t>>>
                  ::erase_abi_cxx11_(in_stack_fffffffffffffd60,in_stack_fffffffffffffd68);
    }
    bVar1 = std::
            map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
            ::empty((map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
                     *)0x24c31c);
    if (bVar1) {
      in_stack_fffffffffffffd70 = &local_130;
      local_188 = (_Base_ptr)
                  std::
                  map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
                  ::begin(in_stack_fffffffffffffd58);
      ppVar5 = std::_Rb_tree_iterator<std::pair<const_long_long,_handlegraph::handle_t>_>::
               operator->((_Rb_tree_iterator<std::pair<const_long_long,_handlegraph::handle_t>_> *)
                          0x24c34c);
      local_190 = (_Base_ptr)
                  std::
                  map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
                  ::begin(in_stack_fffffffffffffd58);
      std::_Rb_tree_iterator<std::pair<const_long_long,_handlegraph::handle_t>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_long_long,_handlegraph::handle_t>_> *)0x24c374);
      pmVar4 = std::
               map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
               ::operator[](in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
      *(undefined8 *)pmVar4->data = *(undefined8 *)(ppVar5->second).data;
      in_stack_fffffffffffffd68._M_node = (_Base_ptr)&local_130;
      local_198 = (_Base_ptr)
                  std::
                  map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
                  ::begin(in_stack_fffffffffffffd58);
      std::_Rb_tree_iterator<std::pair<const_long_long,_handlegraph::handle_t>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_long_long,_handlegraph::handle_t>_> *)0x24c3c2);
      std::
      map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
      ::erase(in_stack_fffffffffffffd60,(key_type *)in_stack_fffffffffffffd58);
    }
    while (bVar1 = std::
                   map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
                   ::empty((map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
                            *)0x24c3e2), ((bVar1 ^ 0xffU) & 1) != 0) {
      std::
      map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
      ::begin(in_stack_fffffffffffffd58);
      ppVar5 = std::_Rb_tree_iterator<std::pair<const_long_long,_handlegraph::handle_t>_>::
               operator->((_Rb_tree_iterator<std::pair<const_long_long,_handlegraph::handle_t>_> *)
                          0x24c40f);
      local_1a0 = *(undefined8 *)(ppVar5->second).data;
      in_stack_fffffffffffffd60 =
           (map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
            *)(**(code **)(*local_10[0] + 0x20))(local_10[0],&local_1a0);
      std::
      map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
      ::erase(in_stack_fffffffffffffd60,(key_type *)in_stack_fffffffffffffd58);
      std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::push_back
                ((vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *)
                 in_stack_fffffffffffffd70,(value_type *)in_stack_fffffffffffffd68._M_node);
      HandleGraph::
      follow_edges<handlegraph::algorithms::topological_order(handlegraph::HandleGraph_const*)::__1>
                ((HandleGraph *)CONCAT17(bVar7,CONCAT16(bVar6,in_stack_fffffffffffffdc0)),
                 in_stack_fffffffffffffdb8,SUB81((ulong)in_stack_fffffffffffffdb0 >> 0x38,0),
                 (anon_class_32_4_69854b6b *)in_stack_fffffffffffffda8);
      HandleGraph::
      follow_edges<handlegraph::algorithms::topological_order(handlegraph::HandleGraph_const*)::__2>
                ((HandleGraph *)CONCAT17(bVar7,CONCAT16(bVar6,in_stack_fffffffffffffdc0)),
                 in_stack_fffffffffffffdb8,SUB81((ulong)in_stack_fffffffffffffdb0 >> 0x38,0),
                 in_stack_fffffffffffffda8);
    }
  }
  local_11 = 1;
  std::
  map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
  ::~map((map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
          *)0x24c56a);
  std::
  map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
  ::~map((map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
          *)0x24c577);
  std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::~vector
            ((vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *)
             in_stack_fffffffffffffd70);
  std::
  map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
  ::~map((map<long_long,_handlegraph::handle_t,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_handlegraph::handle_t>_>_>
          *)0x24c591);
  std::
  unordered_set<std::pair<handlegraph::handle_t,_handlegraph::handle_t>,_std::hash<std::pair<handlegraph::handle_t,_handlegraph::handle_t>_>,_std::equal_to<std::pair<handlegraph::handle_t,_handlegraph::handle_t>_>,_std::allocator<std::pair<handlegraph::handle_t,_handlegraph::handle_t>_>_>
  ::~unordered_set((unordered_set<std::pair<handlegraph::handle_t,_handlegraph::handle_t>,_std::hash<std::pair<handlegraph::handle_t,_handlegraph::handle_t>_>,_std::equal_to<std::pair<handlegraph::handle_t,_handlegraph::handle_t>_>,_std::allocator<std::pair<handlegraph::handle_t,_handlegraph::handle_t>_>_>
                    *)0x24c59e);
  if ((local_11 & 1) == 0) {
    std::vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::~vector
              ((vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *)
               in_stack_fffffffffffffd70);
  }
  return in_RDI;
}

Assistant:

vector<handle_t> topological_order(const HandleGraph* g) {
    
    // Make a vector to hold the ordered and oriented nodes.
    vector<handle_t> sorted;
    sorted.reserve(g->get_node_count());
    
    // Instead of actually removing edges, we add them to this set of masked edges.
    unordered_set<pair<handle_t, handle_t>> masked_edges;
    
    // This (s) is our set of oriented nodes.
    // using a map instead of a set ensures a stable sort across different systems
    map<nid_t, handle_t> s;

    // We find the head and tails, if there are any
    vector<handle_t> heads{head_nodes(g)};
    // No need to fetch the tails since we don't use them

    
    // Maps from node ID to first orientation we suggested for it.
    map<nid_t, handle_t> seeds;
    
    
    for(handle_t& head : heads) {
        // Dump all the heads into the oriented set, rather than having them as
        // seeds. We will only go for cycle-breaking seeds when we run out of
        // heads. This is bad for contiguity/ordering consistency in cyclic
        // graphs and reversing graphs, but makes sure we work out to just
        // topological sort on DAGs. It mimics the effect we used to get when we
        // joined all the head nodes to a new root head node and seeded that. We
        // ignore tails since we only orient right from nodes we pick.
        s[g->get_id(head)] = head;
    }

    // We will use an ordered map handles by ID for nodes we have not visited
    // yet. This ensures a consistent sort order across systems.
    map<nid_t, handle_t> unvisited;
    g->for_each_handle([&](const handle_t& found) {
        if (!s.count(g->get_id(found))) {
            // Only nodes that aren't yet in s are unvisited.
            // Nodes in s are visited but just need to be added tot he ordering.
            unvisited.emplace(g->get_id(found), found);
        }
    });

    while(!unvisited.empty() || !s.empty()) {

        // Put something in s. First go through seeds until we can find one
        // that's not already oriented.
        while(s.empty() && !seeds.empty()) {
            // Look at the first seed
            auto first_seed = (*seeds.begin()).second;

            if(unvisited.count(g->get_id(first_seed))) {
                // We have an unvisited seed. Use it
#ifdef debug
                cerr << "Starting from seed " << g->get_id(first_seed) << " orientation " << g->get_is_reverse(first_seed) << endl;
#endif

                s[g->get_id(first_seed)] = first_seed;
                unvisited.erase(g->get_id(first_seed));
            }
            // Whether we used the seed or not, don't keep it around
            seeds.erase(seeds.begin());
        }

        if(s.empty()) {
            // If we couldn't find a seed, just grab any old node.
            // Since map order is stable across systems, we can take the first node by id and put it locally forward.
#ifdef debug
            cerr << "Starting from arbitrary node " << unvisited.begin()->first << " locally forward" << endl;
#endif

            s[unvisited.begin()->first] = unvisited.begin()->second;
            unvisited.erase(unvisited.begin()->first);
        }

        while (!s.empty()) {
            // Grab an oriented node
            auto n = s.begin()->second;
            s.erase(g->get_id(n));
            // Emit it
            sorted.push_back(n);
#ifdef debug
            cerr << "Using oriented node " << g->get_id(n) << " orientation " << g->get_is_reverse(n) << endl;
#endif

            // See if it has an edge from its start to the start of some node
            // where both were picked as places to break into cycles. A
            // reversing self loop on a cycle entry point is a special case of
            // this.
            g->follow_edges(n, true, [&](const handle_t& prev_node) {
                if(!unvisited.count(g->get_id(prev_node))) {
                    // Look at the edge
                    auto edge = g->edge_handle(prev_node, n);
                    if (masked_edges.count(edge)) {
                        // We removed this edge, so skip it.
                        return;
                    }
                    
#ifdef debug
                    cerr << "\tHas left-side edge to cycle entry point " << g->get_id(prev_node)
                         << " orientation " << g->get_is_reverse(prev_node) << endl;
#endif

                    // Mask the edge
                    masked_edges.insert(edge);
                    
#ifdef debug
                    cerr << "\t\tEdge: " << g->get_id(edge.first) << " " << g->get_is_reverse(edge.first)
                        << " -> " << g->get_id(edge.second) << " " << g->get_is_reverse(edge.second) << endl;
#endif
                }
            });

            // All other connections and self loops are handled by looking off the right side.

            // See what all comes next, minus deleted edges.
            g->follow_edges(n, false, [&](const handle_t& next_node) {

                // Look at the edge
                auto edge = g->edge_handle(n, next_node);
                if (masked_edges.count(edge)) {
                    // We removed this edge, so skip it.
                    return;
                }

#ifdef debug
                cerr << "\tHas edge to " << g->get_id(next_node) << " orientation " << g->get_is_reverse(next_node) << endl;
#endif

                // Mask the edge connecting these nodes in this order and
                // relative orientation, so we can't traverse it again

#ifdef debug
                cerr << "\t\tEdge: " << g->get_id(edge.first) << " " << g->get_is_reverse(edge.first)
                    << " -> " << g->get_id(edge.second) << " " << g->get_is_reverse(edge.second) << endl;
#endif

                // Mask the edge
                masked_edges.insert(edge);

                if(unvisited.count(g->get_id(next_node))) {
                    // We haven't already started here as an arbitrary cycle entry point

#ifdef debug
                    cerr << "\t\tAnd node hasn't been visited yet" << endl;
#endif

                    bool unmasked_incoming_edge = false;
                    g->follow_edges(next_node, true, [&](const handle_t& prev_node) {
                        // Get a handle for each incoming edge
                        auto prev_edge = g->edge_handle(prev_node, next_node);
                        
                        if (!masked_edges.count(prev_edge)) {
                            // We found such an edghe and can stop looking
                            unmasked_incoming_edge = true;
                            return false;
                        }
                        // Otherwise check all the edges on the left of this handle
                        return true;
                    });

                    if(!unmasked_incoming_edge) {

#ifdef debug
                        cerr << "\t\t\tIs last incoming edge" << endl;
#endif
                        // Keep this orientation and put it here
                        s[g->get_id(next_node)] = next_node;
                        // Remember that we've visited and oriented this node, so we
                        // don't need to use it as a seed.
                        unvisited.erase(g->get_id(next_node));

                    } else if(!seeds.count(g->get_id(next_node))) {
                        // We came to this node in this orientation; when we need a
                        // new node and orientation to start from (i.e. an entry
                        // point to the node's cycle), we might as well pick this
                        // one.
                        // Only take it if we don't already know of an orientation for this node.
                        seeds[g->get_id(next_node)] = next_node;

#ifdef debug
                        cerr << "\t\t\tSuggests seed " << g->get_id(next_node) << " orientation " << g->get_is_reverse(next_node) << endl;
#endif
                    }
                } else {
#ifdef debug
                    cerr << "\t\tAnd node was already visited (to break a cycle)" << endl;
#endif
                }
            });
        }
    }

    // Send away our sorted ordering.
    return sorted;
}